

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void gpt_print_usage(int argc,char **argv,gpt_params *params)

{
  fprintf(_stderr,"usage: %s [options]\n",*argv);
  fputc(10,_stderr);
  fwrite("options:\n",9,1,_stderr);
  fwrite("  -h, --help            show this help message and exit\n",0x38,1,_stderr);
  fwrite("  -i, --interactive     run in interactive mode\n",0x30,1,_stderr);
  fwrite("  --interactive-start   run in interactive mode and poll user input at startup\n",0x4f,1,
         _stderr);
  fwrite("  -r PROMPT, --reverse-prompt PROMPT\n",0x25,1,_stderr);
  fwrite("                        in interactive mode, poll user input upon seeing PROMPT\n",0x50,1,
         _stderr);
  fwrite("  --color               colorise output to distinguish prompt and user input from generations\n"
         ,0x5e,1,_stderr);
  fwrite("  -s SEED, --seed SEED  RNG seed (default: -1)\n",0x2f,1,_stderr);
  fprintf(_stderr,
          "  -t N, --threads N     number of threads to use during computation (default: %d)\n",
          (ulong)(uint)params->n_threads);
  fwrite("  -p PROMPT, --prompt PROMPT\n",0x1d,1,_stderr);
  fwrite("                        prompt to start generation with (default: random)\n",0x4a,1,
         _stderr);
  fwrite("  -f FNAME, --file FNAME\n",0x19,1,_stderr);
  fwrite("                        prompt file to start generation.\n",0x39,1,_stderr);
  fprintf(_stderr,"  -n N, --n_predict N   number of tokens to predict (default: %d)\n",
          (ulong)(uint)params->n_predict);
  fprintf(_stderr,"  --top_k N             top-k sampling (default: %d)\n",
          (ulong)(uint)params->top_k);
  fprintf(_stderr,"  --top_p N             top-p sampling (default: %.1f)\n",(double)params->top_p);
  fprintf(_stderr,"  --repeat_last_n N     last n tokens to consider for penalize (default: %d)\n",
          (ulong)(uint)params->repeat_last_n);
  fprintf(_stderr,"  --repeat_penalty N    penalize repeat sequence of tokens (default: %.1f)\n",
          (double)params->repeat_penalty);
  fprintf(_stderr,"  -c N, --ctx_size N    size of the prompt context (default: %d)\n",
          (ulong)(uint)params->n_ctx);
  fprintf(_stderr,"  --temp N              temperature (default: %.1f)\n",(double)params->temp);
  fprintf(_stderr,"  -b N, --batch_size N  batch size for prompt processing (default: %d)\n",
          (ulong)(uint)params->n_batch);
  fwrite("  -m FNAME, --model FNAME\n",0x1a,1,_stderr);
  fprintf(_stderr,"                        model path (default: %s)\n",
          (params->model)._M_dataplus._M_p);
  fputc(10,_stderr);
  return;
}

Assistant:

void gpt_print_usage(int argc, char ** argv, const gpt_params & params) {
    fprintf(stderr, "usage: %s [options]\n", argv[0]);
    fprintf(stderr, "\n");
    fprintf(stderr, "options:\n");
    fprintf(stderr, "  -h, --help            show this help message and exit\n");
    fprintf(stderr, "  -i, --interactive     run in interactive mode\n");
    fprintf(stderr, "  --interactive-start   run in interactive mode and poll user input at startup\n");
    fprintf(stderr, "  -r PROMPT, --reverse-prompt PROMPT\n");
    fprintf(stderr, "                        in interactive mode, poll user input upon seeing PROMPT\n");
    fprintf(stderr, "  --color               colorise output to distinguish prompt and user input from generations\n");
    fprintf(stderr, "  -s SEED, --seed SEED  RNG seed (default: -1)\n");
    fprintf(stderr, "  -t N, --threads N     number of threads to use during computation (default: %d)\n", params.n_threads);
    fprintf(stderr, "  -p PROMPT, --prompt PROMPT\n");
    fprintf(stderr, "                        prompt to start generation with (default: random)\n");
    fprintf(stderr, "  -f FNAME, --file FNAME\n");
    fprintf(stderr, "                        prompt file to start generation.\n");
    fprintf(stderr, "  -n N, --n_predict N   number of tokens to predict (default: %d)\n", params.n_predict);
    fprintf(stderr, "  --top_k N             top-k sampling (default: %d)\n", params.top_k);
    fprintf(stderr, "  --top_p N             top-p sampling (default: %.1f)\n", params.top_p);
    fprintf(stderr, "  --repeat_last_n N     last n tokens to consider for penalize (default: %d)\n", params.repeat_last_n);
    fprintf(stderr, "  --repeat_penalty N    penalize repeat sequence of tokens (default: %.1f)\n", params.repeat_penalty);
    fprintf(stderr, "  -c N, --ctx_size N    size of the prompt context (default: %d)\n", params.n_ctx);
    fprintf(stderr, "  --temp N              temperature (default: %.1f)\n", params.temp);
    fprintf(stderr, "  -b N, --batch_size N  batch size for prompt processing (default: %d)\n", params.n_batch);
    fprintf(stderr, "  -m FNAME, --model FNAME\n");
    fprintf(stderr, "                        model path (default: %s)\n", params.model.c_str());
    fprintf(stderr, "\n");
}